

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

bool __thiscall cmComputeTargetDepends::Compute(cmComputeTargetDepends *this)

{
  bool bVar1;
  allocator local_151;
  string local_150;
  undefined4 local_12c;
  undefined1 local_128 [8];
  cmComputeComponentGraph ccg;
  allocator local_39;
  string local_38;
  cmComputeTargetDepends *local_18;
  cmComputeTargetDepends *this_local;
  
  local_18 = this;
  CollectTargets(this);
  CollectDepends(this);
  if ((this->DebugMode & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"initial",&local_39);
    DisplayGraph(this,&this->InitialGraph,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  cmComputeComponentGraph::cmComputeComponentGraph
            ((cmComputeComponentGraph *)local_128,&this->InitialGraph);
  if ((this->DebugMode & 1U) != 0) {
    DisplayComponents(this,(cmComputeComponentGraph *)local_128);
  }
  bVar1 = CheckComponents(this,(cmComputeComponentGraph *)local_128);
  if (bVar1) {
    bVar1 = ComputeFinalDepends(this,(cmComputeComponentGraph *)local_128);
    if (bVar1) {
      if ((this->DebugMode & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_150,"final",&local_151);
        DisplayGraph(this,&this->FinalGraph,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
      }
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  local_12c = 1;
  cmComputeComponentGraph::~cmComputeComponentGraph((cmComputeComponentGraph *)local_128);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmComputeTargetDepends::Compute()
{
  // Build the original graph.
  this->CollectTargets();
  this->CollectDepends();
  if(this->DebugMode)
    {
    this->DisplayGraph(this->InitialGraph, "initial");
    }

  // Identify components.
  cmComputeComponentGraph ccg(this->InitialGraph);
  if(this->DebugMode)
    {
    this->DisplayComponents(ccg);
    }
  if(!this->CheckComponents(ccg))
    {
    return false;
    }

  // Compute the final dependency graph.
  if(!this->ComputeFinalDepends(ccg))
    {
    return false;
    }
  if(this->DebugMode)
    {
    this->DisplayGraph(this->FinalGraph, "final");
    }

  return true;
}